

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::MethodDescriptorProto::_InternalSerialize
          (MethodDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  MethodOptions *value;
  ulong uVar2;
  anon_union_48_1_493b367e_for_MethodDescriptorProto_4 aVar3;
  uint8_t *puVar4;
  char *in_R9;
  string *psVar5;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  
  aVar3 = this->field_0;
  if (((undefined1  [48])aVar3 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
    psVar5 = (string *)((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.MethodDescriptorProto.name";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(psVar5->_M_dataplus)._M_p,
               (char *)(ulong)(uint)psVar5->_M_string_length,1,0x2a,field_name);
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,psVar5,target);
  }
  if (((undefined1  [48])aVar3 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
    psVar5 = (string *)
             ((ulong)(this->field_0)._impl_.input_type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"google.protobuf.MethodDescriptorProto.input_type";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(psVar5->_M_dataplus)._M_p,
               (char *)(ulong)(uint)psVar5->_M_string_length,1,0x30,field_name_00);
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,psVar5,target);
  }
  if (((undefined1  [48])aVar3 & (undefined1  [48])0x4) != (undefined1  [48])0x0) {
    psVar5 = (string *)
             ((ulong)(this->field_0)._impl_.output_type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_01._M_str = in_R9;
    field_name_01._M_len = (size_t)"google.protobuf.MethodDescriptorProto.output_type";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(psVar5->_M_dataplus)._M_p,
               (char *)(ulong)(uint)psVar5->_M_string_length,1,0x31,field_name_01);
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,3,psVar5,target);
  }
  if (((undefined1  [48])aVar3 & (undefined1  [48])0x8) != (undefined1  [48])0x0) {
    value = (this->field_0)._impl_.options_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (4,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if (((undefined1  [48])aVar3 & (undefined1  [48])0x10) != (undefined1  [48])0x0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.client_streaming_;
    *target = '(';
    target[1] = bVar1;
    target = target + 2;
  }
  if (((undefined1  [48])aVar3 & (undefined1  [48])0x20) != (undefined1  [48])0x0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.server_streaming_;
    *target = '0';
    target[1] = bVar1;
    target = target + 2;
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* MethodDescriptorProto::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const MethodDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MethodDescriptorProto)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          cached_has_bits = this_._impl_._has_bits_[0];
          // optional string name = 1;
          if (cached_has_bits & 0x00000001u) {
            const std::string& _s = this_._internal_name();
            ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                        "google.protobuf.MethodDescriptorProto.name");
            target = stream->WriteStringMaybeAliased(1, _s, target);
          }

          // optional string input_type = 2;
          if (cached_has_bits & 0x00000002u) {
            const std::string& _s = this_._internal_input_type();
            ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                        "google.protobuf.MethodDescriptorProto.input_type");
            target = stream->WriteStringMaybeAliased(2, _s, target);
          }

          // optional string output_type = 3;
          if (cached_has_bits & 0x00000004u) {
            const std::string& _s = this_._internal_output_type();
            ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                        "google.protobuf.MethodDescriptorProto.output_type");
            target = stream->WriteStringMaybeAliased(3, _s, target);
          }

          // optional .google.protobuf.MethodOptions options = 4;
          if (cached_has_bits & 0x00000008u) {
            target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
                4, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
                stream);
          }

          // optional bool client_streaming = 5 [default = false];
          if (cached_has_bits & 0x00000010u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteBoolToArray(
                5, this_._internal_client_streaming(), target);
          }

          // optional bool server_streaming = 6 [default = false];
          if (cached_has_bits & 0x00000020u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteBoolToArray(
                6, this_._internal_server_streaming(), target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MethodDescriptorProto)
          return target;
        }